

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O2

void timer_update(gb_timer_t *timer,int elapsed_cycles)

{
  int iVar1;
  int iVar2;
  
  if (timer == (gb_timer_t *)0x0) {
    __assert_fail("timer != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/loochek[P]gameboy/src/core/timer.c"
                  ,0x61,"void timer_update(gb_timer_t *, int)");
  }
  iVar1 = timer->div_cycles + elapsed_cycles;
  timer->div_cycles = iVar1 % 0x100;
  timer->reg_div = timer->reg_div + (char)(iVar1 / 0x100);
  if ((timer->reg_tac & 4) != 0) {
    iVar2 = elapsed_cycles + timer->timer_cycles;
    iVar1 = timer_periods[timer->reg_tac & 3];
    timer->timer_cycles = iVar2 % iVar1;
    iVar1 = (uint)timer->reg_tima + iVar2 / iVar1;
    if (0xff < iVar1) {
      timer->reg_tima = timer->reg_tma;
      int_request(&timer->gb->intr_ctrl,INT_TIMA);
      return;
    }
    timer->reg_tima = (uint8_t)iVar1;
  }
  return;
}

Assistant:

void timer_update(gb_timer_t *timer, int elapsed_cycles)
{
    assert(timer != NULL);

    timer->div_cycles += elapsed_cycles;
    int div_ticks = timer->div_cycles / DIV_TICK_PERIOD;
    timer->div_cycles %= DIV_TICK_PERIOD;

    timer->reg_div += div_ticks;

    if (timer->reg_tac & 0x04)
    {
        // Timer is enabled

        int timer_period = timer_periods[timer->reg_tac & 0x3];

        timer->timer_cycles += elapsed_cycles;
        int timer_ticks = timer->timer_cycles / timer_period;
        timer->timer_cycles %= timer_period;

        if (timer->reg_tima + timer_ticks > 255)
        {
            timer->reg_tima = timer->reg_tma;
            int_request(&timer->gb->intr_ctrl, INT_TIMA);
        }
        else
            timer->reg_tima += timer_ticks;
    }
}